

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod(MemoryLeakDetector *this)

{
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *leak;
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    for (leak = (this->memoryTable_).table_[lVar1].head_; leak != (MemoryLeakDetectorNode *)0x0;
        leak = *(MemoryLeakDetectorNode **)(leak + 0x38)) {
      if (*(int *)(leak + 0x30) == 3) {
        do {
          if (*(int *)(leak + 0x30) == 3) {
            *(undefined4 *)(leak + 0x30) = 2;
          }
          leak = MemoryLeakDetectorTable::getNextLeak
                           (&this->memoryTable_,leak,mem_leak_period_checking);
        } while (leak != (MemoryLeakDetectorNode *)0x0);
        return;
      }
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x49);
  return;
}

Assistant:

void MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod()
{
    MemoryLeakDetectorNode* leak = memoryTable_.getFirstLeak(mem_leak_period_checking);
    while (leak) {
        if (leak->period_ == mem_leak_period_checking) leak->period_ = mem_leak_period_enabled;
        leak = memoryTable_.getNextLeak(leak, mem_leak_period_checking);
    }
}